

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O1

void rlTextureParameters(uint id,int param,int value)

{
  GLenum GVar1;
  char *text;
  GLfloat GVar2;
  
  (*glad_glBindTexture)(0xde1,id);
  (*glad_glTexParameterf)(0xde1,0x84fe,1.0);
  if (param < 0x3000) {
    if (1 < param - 0x2800U) {
      if (1 < param - 0x2802U) goto LAB_0015fc1e;
      if (value == 0x8742) {
        if (RLGL.ExtSupported.texMirrorClamp != true) {
          text = "GL: Clamp mirror wrap mode not supported (GL_MIRROR_CLAMP_EXT)";
          goto LAB_0015fc12;
        }
        value = 0x8742;
      }
    }
    (*glad_glTexParameteri)(0xde1,param,value);
  }
  else {
    if (param == 0x3000) {
      GVar2 = (GLfloat)value;
      if (GVar2 <= RLGL.ExtSupported.maxAnisotropyLevel) {
        GVar1 = 0x84fe;
      }
      else {
        if (RLGL.ExtSupported.maxAnisotropyLevel <= 0.0) {
          text = "GL: Anisotropic filtering not supported";
LAB_0015fc12:
          TraceLog(4,text);
          goto LAB_0015fc1e;
        }
        TraceLog(4,"GL: Maximum anisotropic filter level supported is %iX",(ulong)id,
                 (ulong)(uint)(int)RLGL.ExtSupported.maxAnisotropyLevel);
        GVar1 = 0x84fe;
      }
    }
    else {
      if (param != 0x4000) goto LAB_0015fc1e;
      GVar2 = (float)value / 100.0;
      GVar1 = 0x8501;
    }
    (*glad_glTexParameterf)(0xde1,GVar1,GVar2);
  }
LAB_0015fc1e:
  (*glad_glBindTexture)(0xde1,0);
  return;
}

Assistant:

void rlTextureParameters(unsigned int id, int param, int value)
{
    glBindTexture(GL_TEXTURE_2D, id);

#if !defined(GRAPHICS_API_OPENGL_11)
    // Reset anisotropy filter, in case it was set
    glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_MAX_ANISOTROPY_EXT, 1.0f);
#endif

    switch (param)
    {
        case RL_TEXTURE_WRAP_S:
        case RL_TEXTURE_WRAP_T:
        {
            if (value == RL_TEXTURE_WRAP_MIRROR_CLAMP)
            {
#if !defined(GRAPHICS_API_OPENGL_11)
                if (RLGL.ExtSupported.texMirrorClamp) glTexParameteri(GL_TEXTURE_2D, param, value);
                else TRACELOG(RL_LOG_WARNING, "GL: Clamp mirror wrap mode not supported (GL_MIRROR_CLAMP_EXT)");
#endif
            }
            else glTexParameteri(GL_TEXTURE_2D, param, value);

        } break;
        case RL_TEXTURE_MAG_FILTER:
        case RL_TEXTURE_MIN_FILTER: glTexParameteri(GL_TEXTURE_2D, param, value); break;
        case RL_TEXTURE_FILTER_ANISOTROPIC:
        {
#if !defined(GRAPHICS_API_OPENGL_11)
            if (value <= RLGL.ExtSupported.maxAnisotropyLevel) glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_MAX_ANISOTROPY_EXT, (float)value);
            else if (RLGL.ExtSupported.maxAnisotropyLevel > 0.0f)
            {
                TRACELOG(RL_LOG_WARNING, "GL: Maximum anisotropic filter level supported is %iX", id, (int)RLGL.ExtSupported.maxAnisotropyLevel);
                glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_MAX_ANISOTROPY_EXT, (float)value);
            }
            else TRACELOG(RL_LOG_WARNING, "GL: Anisotropic filtering not supported");
#endif
        } break;
#if defined(GRAPHICS_API_OPENGL_33)
        case RL_TEXTURE_MIPMAP_BIAS_RATIO: glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_LOD_BIAS, value/100.0f);
#endif
        default: break;
    }

    glBindTexture(GL_TEXTURE_2D, 0);
}